

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateAddAlias(HelicsFederate fed,char *interfaceName,char *alias,HelicsError *err)

{
  Federate *pFVar1;
  HelicsError *in_RCX;
  char *in_RDX;
  char *in_RSI;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffa8;
  Federate *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc8;
  
  pFVar1 = getFed(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (pFVar1 != (Federate *)0x0) {
    if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
      assignError(in_RCX,-4,"Interface name cannot be empty");
    }
    else if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
      assignError(in_RCX,-4,"Alias cannot be empty");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                 (char *)in_stack_ffffffffffffffa8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                 (char *)in_stack_ffffffffffffffa8);
      helics::Federate::addAlias
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void helicsFederateAddAlias(HelicsFederate fed, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        fedObj->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}